

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLSLMaterialRenderer.cpp
# Opt level: O2

void __thiscall
irr::video::COpenGLSLMaterialRenderer::~COpenGLSLMaterialRenderer(COpenGLSLMaterialRenderer *this)

{
  ~COpenGLSLMaterialRenderer
            ((COpenGLSLMaterialRenderer *)
             ((long)&(this->super_IMaterialRenderer)._vptr_IMaterialRenderer +
             (long)(this->super_IMaterialRenderer)._vptr_IMaterialRenderer[-3]));
  return;
}

Assistant:

COpenGLSLMaterialRenderer::~COpenGLSLMaterialRenderer()
{
	if (CallBack)
		CallBack->drop();

	if (Program) {
		GLhandleARB shaders[8];
		GLint count;
		Driver->extGlGetAttachedObjects(Program, 8, &count, shaders);
		// avoid bugs in some drivers, which return larger numbers
		// use int variable to avoid compiler problems with template
		int mincount = core::min_((int)count, 8);
		for (int i = 0; i < mincount; ++i)
			Driver->extGlDeleteObject(shaders[i]);
		Driver->extGlDeleteObject(Program);
		Program = 0;
	}

	if (Program2) {
		GLuint shaders[8];
		GLint count;
		Driver->extGlGetAttachedShaders(Program2, 8, &count, shaders);
		// avoid bugs in some drivers, which return larger numbers
		// use int variable to avoid compiler problems with template
		int mincount = core::min_((int)count, 8);
		for (int i = 0; i < mincount; ++i)
			Driver->extGlDeleteShader(shaders[i]);
		Driver->extGlDeleteProgram(Program2);
		Program2 = 0;
	}

	UniformInfo.clear();
}